

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_solve_seq.c
# Opt level: O3

void LP_dgesl(double *a,int lda,int n,int *ipvt,double *b,int job)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = n - 1;
  uVar4 = (ulong)(uint)n;
  if (job == 0) {
    if (1 < n) {
      uVar8 = 0;
      do {
        uVar3 = ipvt[uVar8];
        if (uVar8 != uVar3) {
          dVar1 = b[(int)uVar3];
          b[(int)uVar3] = b[uVar8];
          b[uVar8] = dVar1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    if (0 < n) {
      iVar6 = uVar7 * (lda + 1);
      do {
        b[uVar4 - 1] = b[uVar4 - 1] / a[iVar6];
        iVar6 = iVar6 + ~lda;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  else if (0 < n) {
    iVar6 = 0;
    uVar8 = 0;
    do {
      b[uVar8] = b[uVar8] / a[iVar6];
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + lda + 1;
    } while (uVar4 != uVar8);
    if (2 < n) {
      lVar5 = 0;
      do {
        dVar1 = b[uVar4 + lVar5 + -2];
        b[uVar4 + lVar5 + -2] = dVar1 + 0.0;
        iVar6 = ipvt[uVar4 + lVar5 + -2];
        if (n + -2 + (int)lVar5 != iVar6) {
          dVar2 = b[iVar6];
          b[iVar6] = dVar1 + 0.0;
          b[uVar4 + lVar5 + -2] = dVar2;
        }
        lVar5 = lVar5 + -1;
      } while (1 - (ulong)uVar7 != lVar5);
    }
  }
  return;
}

Assistant:

void LP_dgesl(a,lda,n,ipvt,b,job)
int lda,n,ipvt[],job;
REAL a[],b[];

/* We would like to declare a[][lda], but c does not allow it.  In this
function, references to a[i][j] are written a[lda*i+j].  */

/*
     LP_dgesl solves the double precision system
     a * x = b  or  trans(a) * x = b
     using the factors computed by dgeco or LP_dgefa.

     on entry

        a       double precision[n][lda]
                the output from dgeco or LP_dgefa.

        lda     integer
                the leading dimension of the array  a .

        n       integer
                the order of the matrix  a .

        ipvt    integer[n]
                the pivot vector from dgeco or LP_dgefa.

        b       double precision[n]
                the right hand side vector.

        job     integer
                = 0         to solve  a*x = b ,
                = nonzero   to solve  trans(a)*x = b  where
                            trans(a)  is the transpose.

    on return

        b       the solution vector  x .

     error condition

        a division by zero will occur if the input factor contains a
        zero on the diagonal.  technically this indicates singularity
        but it is often caused by improper arguments or improper
        setting of lda .  it will not occur if the subroutines are
        called correctly and if dgeco has set rcond .gt. 0.0
        or LP_dgefa has set info .eq. 0 .

     to compute  inverse(a) * c  where  c  is a matrix
     with  p  columns
           dgeco(a,lda,n,ipvt,rcond,z)
           if (!rcond is too small){
           	for (j=0,j<p,j++)
              		LP_dgesl(a,lda,n,ipvt,c[j][0],0);
	   }

     linpack. this version dated 08/14/78 .
     cleve moler, university of new mexico, argonne national lab.

     functions

     blas LP_daxpy,LP_ddot
*/
{
/*     internal variables	*/

	REAL t;
	int k,kb,l,nm1;

	nm1 = n - 1;
	if (job == 0) {

		/* job = 0 , solve  a * x = b
		   first solve  l*y = b    	*/

		if (nm1 >= 1) {
			for (k = 0; k < nm1; k++) {
				l = ipvt[k];
				t = b[l];
				if (l != k){ 
					b[l] = b[k];
					b[k] = t;
				}	
				LP_daxpy(n-(k+1),t,&a[lda*k+k+1],1,&b[k+1],1);
			}
		} 

		/* now solve  u*x = y */

		for (kb = 0; kb < n; kb++) {
		    k = n - (kb + 1);
		    b[k] = b[k]/a[lda*k+k];
		    t = -b[k];
		    LP_daxpy(k,t,&a[lda*k+0],1,&b[0],1);
		}
	}
	else { 

		/* job = nonzero, solve  trans(a) * x = b
		   first solve  trans(u)*y = b 			*/

		for (k = 0; k < n; k++) {
			t = LP_ddot(k,&a[lda*k+0],1,&b[0],1);
			b[k] = (b[k] - t)/a[lda*k+k];
		}

		/* now solve trans(l)*x = y	*/

		if (nm1 >= 1) {
			for (kb = 1; kb < nm1; kb++) {
				k = n - (kb+1);
				b[k] = b[k] + LP_ddot(n-(k+1),&a[lda*k+k+1],1,&b[k+1],1);
				l = ipvt[k];
				if (l != k) {
					t = b[l];
					b[l] = b[k];
					b[k] = t;
				}
			}
		}
	}
}